

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O1

yajl_gen_status yajl_gen_string(yajl_gen g,uchar *str,size_t len)

{
  yajl_print_t p_Var1;
  void *pvVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  
  if (((g->flags & 8) != 0) && (iVar3 = yajl_string_validate_utf8(str,len), iVar3 == 0)) {
    return yajl_gen_invalid_string;
  }
  switch(g->state[g->depth]) {
  case yajl_gen_map_key:
  case yajl_gen_in_array:
    (*g->print)(g->ctx,",",1);
    if ((g->flags & 1) == 0) goto switchD_00105451_caseD_4;
    pcVar6 = "\n";
    break;
  case yajl_gen_map_val:
    (*g->print)(g->ctx,":",1);
    if ((g->flags & 1) == 0) goto switchD_00105451_caseD_4;
    pcVar6 = " ";
    break;
  default:
    goto switchD_00105451_caseD_4;
  case yajl_gen_complete:
    return yajl_gen_generation_complete;
  case yajl_gen_error:
    return yajl_gen_in_error_state;
  }
  (*g->print)(g->ctx,pcVar6,1);
switchD_00105451_caseD_4:
  if ((((g->flags & 1) != 0) && (g->state[g->depth] != yajl_gen_map_val)) && (g->depth != 0)) {
    uVar5 = 0;
    do {
      p_Var1 = g->print;
      pvVar2 = g->ctx;
      pcVar6 = g->indentString;
      sVar4 = strlen(pcVar6);
      (*p_Var1)(pvVar2,pcVar6,sVar4 & 0xffffffff);
      uVar5 = uVar5 + 1;
    } while (uVar5 < g->depth);
  }
  (*g->print)(g->ctx,"\"",1);
  yajl_string_encode(g->print,g->ctx,str,len,g->flags & 0x10);
  (*g->print)(g->ctx,"\"",1);
  uVar5 = g->depth;
  if ((ulong)g->state[uVar5] < 5) {
    g->state[uVar5] = *(yajl_gen_state *)(&DAT_00107848 + (ulong)g->state[uVar5] * 4);
  }
  if (((g->flags & 1) != 0) && (g->state[uVar5] == yajl_gen_complete)) {
    (*g->print)(g->ctx,"\n",1);
  }
  return yajl_gen_status_ok;
}

Assistant:

yajl_gen_status
yajl_gen_string(yajl_gen g, const unsigned char * str,
                size_t len)
{
    // if validation is enabled, check that the string is valid utf8
    // XXX: This checking could be done a little faster, in the same pass as
    // the string encoding
    if (g->flags & yajl_gen_validate_utf8) {
        if (!yajl_string_validate_utf8(str, len)) {
            return yajl_gen_invalid_string;
        }
    }
    ENSURE_VALID_STATE; INSERT_SEP; INSERT_WHITESPACE;
    g->print(g->ctx, "\"", 1);
    yajl_string_encode(g->print, g->ctx, str, len, g->flags & yajl_gen_escape_solidus);
    g->print(g->ctx, "\"", 1);
    APPENDED_ATOM;
    FINAL_NEWLINE;
    return yajl_gen_status_ok;
}